

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
          (internal *this,char *expected_expression,char *actual_expression,
          SquareMatrix<3> *expected,SquareMatrix<3> *actual)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  Float *pFVar4;
  SquareMatrix<3> *value;
  SquareMatrix<3> *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  Float *pFVar6;
  ulong uVar7;
  ulong uVar8;
  AssertionResult AVar9;
  string local_60;
  string local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar5
  ;
  
  fVar1 = expected->m[0][0];
  fVar2 = actual->m[0][0];
  value = (SquareMatrix<3> *)actual_expression;
  if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
    pFVar4 = expected->m[0] + 1;
    pFVar6 = actual->m[0] + 1;
    value = (SquareMatrix<3> *)0x0;
    uVar7 = 0;
    while( true ) {
      uVar3 = 0;
      do {
        uVar8 = uVar3;
        if (uVar8 == 2) goto LAB_002cc18c;
      } while ((pFVar4[uVar8] == pFVar6[uVar8]) &&
              (uVar3 = uVar8 + 1, !NAN(pFVar4[uVar8]) && !NAN(pFVar6[uVar8])));
      if (uVar8 < 2) break;
LAB_002cc18c:
      value = (SquareMatrix<3> *)(ulong)(1 < uVar7);
      if (uVar7 + 1 == 3) break;
      fVar1 = expected->m[uVar7 + 1][0];
      pFVar4 = pFVar4 + 3;
      pFVar6 = pFVar6 + 3;
      fVar2 = actual->m[uVar7 + 1][0];
      if ((fVar1 != fVar2) || (uVar7 = uVar7 + 1, NAN(fVar1) || NAN(fVar2))) break;
    }
    if (value != (SquareMatrix<3> *)0x0) {
      AVar9 = AssertionSuccess();
      sVar5 = AVar9.message_.ptr_;
      goto LAB_002cc23a;
    }
  }
  PrintToString<pbrt::SquareMatrix<3>>(&local_40,(testing *)expected,value);
  PrintToString<pbrt::SquareMatrix<3>>(&local_60,(testing *)actual,value_00);
  AVar9 = EqFailure(this,expected_expression,actual_expression,&local_40,&local_60,false);
  sVar5 = AVar9.message_.ptr_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    sVar5.ptr_ = extraout_RDX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    sVar5.ptr_ = extraout_RDX_00;
  }
LAB_002cc23a:
  AVar9.message_.ptr_ = sVar5.ptr_;
  AVar9._0_8_ = this;
  return AVar9;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}